

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# optionparser.h
# Opt level: O1

bool option::Parser::streqabbr(char *st1,char *st2,longlong min)

{
  char *pcVar1;
  char *pcVar2;
  char *pcVar3;
  bool bVar4;
  
  bVar4 = *st1 == '\0';
  if (!bVar4) {
    pcVar3 = st1;
    if (*st1 == *st2) {
      pcVar2 = st2 + 1;
      do {
        st2 = pcVar2;
        pcVar1 = pcVar3 + 1;
        bVar4 = *pcVar1 == '\0';
        if (bVar4) goto LAB_0010e782;
        pcVar3 = pcVar3 + 1;
        pcVar2 = st2 + 1;
      } while (*pcVar1 == *st2);
    }
    if (!bVar4) {
      if (min < 1) {
        return false;
      }
      if ((long)pcVar3 - (long)st1 < min) {
        return false;
      }
    }
  }
LAB_0010e782:
  return *st2 == '=' || *st2 == '\0';
}

Assistant:

static bool streqabbr(const char* st1, const char* st2, long long min)
  {
    const char* st1start = st1;
    while (*st1 != 0 && (*st1 == *st2))
    {
      ++st1;
      ++st2;
    }

    return (*st1 == 0 || (min > 0 && (st1 - st1start) >= min)) && (*st2 == 0 || *st2 == '=');
  }